

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O1

ZyanStatus
ZydisFormatterTokenizeOperand
          (ZydisFormatter *formatter,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operand,void *buffer,ZyanUSize length,ZyanU64 runtime_address,
          ZydisFormatterTokenConst **token,void *user_data)

{
  void *pvVar1;
  ZyanStatus ZVar2;
  ZydisFormatterTokenConst *pZVar3;
  ZydisFormatterBuffer formatter_buffer;
  ZydisFormatterContext local_a0;
  ZydisFormatterBuffer local_78;
  
  ZVar2 = 0x80100004;
  if (token != (ZydisFormatterTokenConst **)0x0 &&
      (2 < length &&
      ((buffer != (void *)0x0 && operand != (ZydisDecodedOperand *)0x0) &&
      (instruction != (ZydisDecodedInstruction *)0x0 && formatter != (ZydisFormatter *)0x0)))) {
    *(undefined2 *)buffer = 0;
    pvVar1 = (void *)((long)buffer + 2);
    local_78.capacity = length - 2;
    local_78.is_token_list = '\x01';
    local_78.string.flags = '\x01';
    local_78.string.vector.allocator = (ZyanAllocator *)0x0;
    local_78.string.vector.growth_factor = '\x01';
    local_78.string.vector.shrink_threshold = '\0';
    local_78.string.vector.destructor = (ZyanMemberProcedure)0x0;
    local_78.string.vector.element_size = 1;
    local_78.string.vector.size = 1;
    *(undefined1 *)((long)buffer + 2) = 0;
    local_a0.operands = (ZydisDecodedOperand *)0x0;
    local_a0.user_data = user_data;
    local_a0.instruction = instruction;
    local_a0.operand = operand;
    local_a0.runtime_address = runtime_address;
    local_78.string.vector.capacity = local_78.capacity;
    local_78.string.vector.data = pvVar1;
    if ((formatter->func_pre_operand == (ZydisFormatterFunc)0x0) ||
       (ZVar2 = (*formatter->func_pre_operand)(formatter,&local_78,&local_a0), -1 < (int)ZVar2)) {
      switch((local_a0.operand)->type) {
      case ZYDIS_OPERAND_TYPE_REGISTER:
        ZVar2 = (*formatter->func_format_operand_reg)(formatter,&local_78,&local_a0);
        break;
      case ZYDIS_OPERAND_TYPE_MEMORY:
        ZVar2 = (*formatter->func_format_operand_mem)(formatter,&local_78,&local_a0);
        break;
      case ZYDIS_OPERAND_TYPE_POINTER:
        ZVar2 = (*formatter->func_format_operand_ptr)(formatter,&local_78,&local_a0);
        break;
      case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        ZVar2 = (*formatter->func_format_operand_imm)(formatter,&local_78,&local_a0);
        break;
      default:
        return 0x80100004;
      }
      if ((-1 < (int)ZVar2) &&
         ((formatter->func_post_operand == (ZydisFormatterFunc)0x0 ||
          (ZVar2 = (*formatter->func_post_operand)(formatter,&local_78,&local_a0), -1 < (int)ZVar2))
         )) {
        pZVar3 = (ZydisFormatterTokenConst *)((long)pvVar1 + (ulong)*(byte *)((long)buffer + 1));
        if ((ulong)*(byte *)((long)buffer + 1) == 0) {
          pZVar3 = (ZydisFormatterTokenConst *)buffer;
        }
        *token = pZVar3;
        ZVar2 = 0x100000;
      }
    }
  }
  return ZVar2;
}

Assistant:

ZyanStatus ZydisFormatterTokenizeOperand(const ZydisFormatter* formatter,
    const ZydisDecodedInstruction* instruction, const ZydisDecodedOperand* operand,
    void* buffer, ZyanUSize length, ZyanU64 runtime_address, ZydisFormatterTokenConst** token,
    void* user_data)
{
    if (!formatter || !instruction || !operand || !buffer ||
        (length <= sizeof(ZydisFormatterToken)) || !token)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZydisFormatterToken* first_token;
    ZydisFormatterBuffer formatter_buffer;
    ZydisFormatterBufferInitTokenized(&formatter_buffer, &first_token, buffer, length);

    ZydisFormatterContext context;
    context.instruction     = instruction;
    context.operands        = ZYAN_NULL;
    context.runtime_address = runtime_address;
    context.operand         = operand;
    context.user_data       = user_data;

    // We ignore `ZYDIS_STATUS_SKIP_TOKEN` for all operand-functions as it does not make any sense
    // to skip the only operand printed by this function

    if (formatter->func_pre_operand)
    {
        ZYAN_CHECK(formatter->func_pre_operand(formatter, &formatter_buffer, &context));
    }

    switch (context.operand->type)
    {
    case ZYDIS_OPERAND_TYPE_REGISTER:
        ZYAN_CHECK(formatter->func_format_operand_reg(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_MEMORY:
        ZYAN_CHECK(formatter->func_format_operand_mem(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        ZYAN_CHECK(formatter->func_format_operand_imm(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_POINTER:
        ZYAN_CHECK(formatter->func_format_operand_ptr(formatter, &formatter_buffer, &context));
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (formatter->func_post_operand)
    {
        ZYAN_CHECK(formatter->func_post_operand(formatter, &formatter_buffer, &context));
    }

    if (first_token->next)
    {
        *token = (ZydisFormatterTokenConst*)((ZyanU8*)first_token + sizeof(ZydisFormatterToken) +
            first_token->next);
        return ZYAN_STATUS_SUCCESS;
    }

    *token = first_token;
    return ZYAN_STATUS_SUCCESS;
}